

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpdec.c
# Opt level: O2

int ReadWebP(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  int iVar1;
  VP8StatusCode VVar2;
  uint32_t uVar3;
  WebPDemuxer *dmux;
  uint32_t *puVar4;
  long *plVar5;
  long lVar6;
  bool bVar7;
  ulong stride;
  bool bVar8;
  bool bVar9;
  WebPChunkIterator local_168;
  WebPData webp_data;
  WebPDecoderConfig config;
  
  if (pic == (WebPPicture *)0x0 || (data_size == 0 || data == (uint8_t *)0x0)) {
    return 0;
  }
  iVar1 = WebPInitDecoderConfigInternal(&config,0x209);
  if (iVar1 == 0) {
    fwrite("Library version mismatch!\n",0x1a,1,_stderr);
    return 0;
  }
  VVar2 = WebPGetFeatures(data,data_size,&config.input);
  if (VVar2 != VP8_STATUS_OK) {
    PrintWebPError("input data",VVar2);
    return 0;
  }
  bVar8 = keep_alpha != 0;
  bVar9 = config.input.has_alpha != 0;
  bVar7 = bVar9 && bVar8;
  pic->width = config.input.width;
  pic->height = config.input.height;
  if (pic->use_argb == 0) {
    stride = ((ulong)bVar7 * 2 + 3) * (long)config.input.width >> 1;
    pic->colorspace = (uint)bVar7 * 4;
  }
  else {
    stride = (long)config.input.width << 2;
  }
  iVar1 = ImgIoUtilCheckSizeArgumentsOverflow(stride,(long)config.input.height);
  VVar2 = VP8_STATUS_OUT_OF_MEMORY;
  if (iVar1 == 0) {
LAB_0010754b:
    PrintWebPError("input data",VVar2);
    bVar8 = true;
    bVar7 = false;
  }
  else {
    iVar1 = WebPPictureAlloc(pic);
    VVar2 = VP8_STATUS_OUT_OF_MEMORY;
    if (iVar1 == 0) goto LAB_0010754b;
    if (pic->use_argb == 0) {
      config.output.colorspace = bVar7 + MODE_YUV;
      config.output.u.RGBA.rgba = pic->y;
      config.output.u.YUVA.u = pic->u;
      config.output.u.RGBA.size = (size_t)pic->v;
      if (bVar9 && bVar8) {
        config.output.u.YUVA.a = pic->a;
      }
      else {
        config.output.u.YUVA.a = (uint8_t *)0x0;
      }
      plVar5 = (long *)((long)&config.output.u + 0x48);
      config.output.u.YUVA.y_stride = pic->y_stride;
      config.output.u.YUVA.u_stride = pic->uv_stride;
      config.output.u.YUVA.a_stride = 0;
      if (bVar9 && bVar8) {
        config.output.u.YUVA.a_stride = pic->a_stride;
      }
      iVar1 = pic->height;
      config.output.u.YUVA.y_size = (size_t)(config.output.u.YUVA.y_stride * iVar1);
      config.output.u.YUVA.u_size = (size_t)(((iVar1 + 1) / 2) * config.output.u.YUVA.u_stride);
      iVar1 = pic->a_stride * iVar1;
      config.output.u.YUVA.v_stride = config.output.u.YUVA.u_stride;
      config.output.u.YUVA.v_size = config.output.u.YUVA.u_size;
    }
    else {
      plVar5 = (long *)((long)&config.output.u + 0x10);
      config.output.colorspace = MODE_BGRA;
      config.output.u.RGBA.rgba = (uint8_t *)pic->argb;
      iVar1 = pic->argb_stride * 4;
      config.output.u.RGBA.stride = iVar1;
      iVar1 = iVar1 * pic->height;
    }
    *plVar5 = (long)iVar1;
    config.output.is_external_memory = 1;
    VVar2 = DecodeWebP(data,data_size,&config);
    if ((keep_alpha == 0 && VVar2 == VP8_STATUS_OK) && (pic->use_argb != 0)) {
      puVar4 = pic->argb;
      for (iVar1 = 0; iVar1 < pic->height; iVar1 = iVar1 + 1) {
        for (lVar6 = 0; lVar6 < pic->width; lVar6 = lVar6 + 1) {
          *(undefined1 *)((long)puVar4 + lVar6 * 4 + 3) = 0xff;
        }
        puVar4 = puVar4 + pic->argb_stride;
      }
    }
    if (VVar2 != VP8_STATUS_OK) goto LAB_0010754b;
    bVar7 = true;
    bVar8 = false;
  }
  WebPFreeDecBuffer(&config.output);
  if (bVar7 && metadata != (Metadata *)0x0) {
    webp_data.bytes = data;
    webp_data.size = data_size;
    dmux = WebPDemuxInternal(&webp_data,0,(WebPDemuxState *)0x0,0x107);
    if (dmux == (WebPDemuxer *)0x0) {
      PrintWebPError("metadata",3);
LAB_00107697:
      WebPPictureFree(pic);
      return 0;
    }
    uVar3 = WebPDemuxGetI(dmux,WEBP_FF_FORMAT_FLAGS);
    if (((uVar3 & 0x20) != 0) && (iVar1 = WebPDemuxGetChunk(dmux,"ICCP",1,&local_168), iVar1 != 0))
    {
      MetadataCopy((char *)local_168.chunk.bytes,local_168.chunk.size,&metadata->iccp);
      WebPDemuxReleaseChunkIterator(&local_168);
    }
    if (((uVar3 & 8) != 0) && (iVar1 = WebPDemuxGetChunk(dmux,"EXIF",1,&local_168), iVar1 != 0)) {
      MetadataCopy((char *)local_168.chunk.bytes,local_168.chunk.size,&metadata->exif);
      WebPDemuxReleaseChunkIterator(&local_168);
    }
    if (((uVar3 & 4) != 0) && (iVar1 = WebPDemuxGetChunk(dmux,"XMP ",1,&local_168), iVar1 != 0)) {
      MetadataCopy((char *)local_168.chunk.bytes,local_168.chunk.size,&metadata->xmp);
      WebPDemuxReleaseChunkIterator(&local_168);
    }
    WebPDemuxDelete(dmux);
  }
  else if (bVar8) goto LAB_00107697;
  return 1;
}

Assistant:

int ReadWebP(const uint8_t* const data, size_t data_size,
             WebPPicture* const pic,
             int keep_alpha, Metadata* const metadata) {
  int ok = 0;
  VP8StatusCode status = VP8_STATUS_OK;
  WebPDecoderConfig config;
  WebPDecBuffer* const output_buffer = &config.output;
  WebPBitstreamFeatures* const bitstream = &config.input;

  if (data == NULL || data_size == 0 || pic == NULL) return 0;

  if (!WebPInitDecoderConfig(&config)) {
    fprintf(stderr, "Library version mismatch!\n");
    return 0;
  }

  status = WebPGetFeatures(data, data_size, bitstream);
  if (status != VP8_STATUS_OK) {
    PrintWebPError("input data", status);
    return 0;
  }

  do {
    const int has_alpha = keep_alpha && bitstream->has_alpha;
    uint64_t stride;
    pic->width = bitstream->width;
    pic->height = bitstream->height;
    if (pic->use_argb) {
      stride = (uint64_t)bitstream->width * 4;
    } else {
      stride = (uint64_t)bitstream->width * (has_alpha ? 5 : 3) / 2;
      pic->colorspace = has_alpha ? WEBP_YUV420A : WEBP_YUV420;
    }

    if (!ImgIoUtilCheckSizeArgumentsOverflow(stride, bitstream->height)) {
      status = VP8_STATUS_OUT_OF_MEMORY;
      break;
    }

    ok = WebPPictureAlloc(pic);
    if (!ok) {
      status = VP8_STATUS_OUT_OF_MEMORY;
      break;
    }
    if (pic->use_argb) {
#ifdef WORDS_BIGENDIAN
      output_buffer->colorspace = MODE_ARGB;
#else
      output_buffer->colorspace = MODE_BGRA;
#endif
      output_buffer->u.RGBA.rgba = (uint8_t*)pic->argb;
      output_buffer->u.RGBA.stride = pic->argb_stride * sizeof(uint32_t);
      output_buffer->u.RGBA.size = output_buffer->u.RGBA.stride * pic->height;
    } else {
      output_buffer->colorspace = has_alpha ? MODE_YUVA : MODE_YUV;
      output_buffer->u.YUVA.y = pic->y;
      output_buffer->u.YUVA.u = pic->u;
      output_buffer->u.YUVA.v = pic->v;
      output_buffer->u.YUVA.a = has_alpha ? pic->a : NULL;
      output_buffer->u.YUVA.y_stride = pic->y_stride;
      output_buffer->u.YUVA.u_stride = pic->uv_stride;
      output_buffer->u.YUVA.v_stride = pic->uv_stride;
      output_buffer->u.YUVA.a_stride = has_alpha ? pic->a_stride : 0;
      output_buffer->u.YUVA.y_size = pic->height * pic->y_stride;
      output_buffer->u.YUVA.u_size = (pic->height + 1) / 2 * pic->uv_stride;
      output_buffer->u.YUVA.v_size = (pic->height + 1) / 2 * pic->uv_stride;
      output_buffer->u.YUVA.a_size = pic->height * pic->a_stride;
    }
    output_buffer->is_external_memory = 1;

    status = DecodeWebP(data, data_size, &config);
    ok = (status == VP8_STATUS_OK);
    if (ok && !keep_alpha && pic->use_argb) {
      // Need to wipe out the alpha value, as requested.
      int x, y;
      uint32_t* argb = pic->argb;
      for (y = 0; y < pic->height; ++y) {
        for (x = 0; x < pic->width; ++x) argb[x] |= 0xff000000u;
        argb += pic->argb_stride;
      }
    }
  } while (0);   // <- so we can 'break' out of the loop

  if (status != VP8_STATUS_OK) {
    PrintWebPError("input data", status);
    ok = 0;
  }

  WebPFreeDecBuffer(output_buffer);

  if (ok && metadata != NULL) {
    ok = ExtractMetadata(data, data_size, metadata);
    if (!ok) {
      PrintWebPError("metadata", VP8_STATUS_BITSTREAM_ERROR);
    }
  }
  if (!ok) WebPPictureFree(pic);
  return ok;
}